

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O2

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
MessageSetUnknownButValidTypeId<proto2_unittest::TestAllTypes>::TestBody
          (MessageSetUnknownButValidTypeId<proto2_unittest::TestAllTypes> *this)

{
  char *in_R9;
  AssertHelper AStack_88;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  string local_78;
  AssertionResult gtest_ar_;
  char encoded [8];
  TestMessageSet message;
  
  builtin_strncpy(encoded,"\v\x1a\x02\b",5);
  encoded[5] = '\x10';
  encoded[6] = '\x04';
  encoded[7] = '\f';
  proto2_wireformat_unittest::TestMessageSet::TestMessageSet(&message);
  gtest_ar_.success_ = MessageLite::ParseFromArray((MessageLite *)&message,encoded,8);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)&gtest_ar_,
               (AssertionResult *)"message.ParseFromArray(encoded, sizeof(encoded))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x29f,local_78._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&AStack_88);
    std::__cxx11::string::~string((string *)&local_78);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_80._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  proto2_wireformat_unittest::TestMessageSet::~TestMessageSet(&message);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, MessageSetUnknownButValidTypeId) {
  const char encoded[] = {
      013,     // 1: SGROUP
      032, 2,  // 3:LEN 2
      010, 0,  // 1:0
      020, 4,  // 2:4
      014      // 1: EGROUP
  };
  typename TestFixture::TestMessageSet message;
  EXPECT_TRUE(message.ParseFromArray(encoded, sizeof(encoded)));
}